

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_result.cpp
# Opt level: O1

bool __thiscall
duckdb::QueryResultChunkScanState::InternalLoad(QueryResultChunkScanState *this,ErrorData *error)

{
  bool bVar1;
  StreamQueryResult *this_00;
  
  if ((this->result->super_BaseQueryResult).type == STREAM_RESULT) {
    this_00 = QueryResult::Cast<duckdb::StreamQueryResult>(this->result);
    bVar1 = StreamQueryResult::IsOpen(this_00);
    if (!bVar1) {
      return true;
    }
  }
  bVar1 = QueryResult::TryFetch(this->result,&(this->super_ChunkScanState).current_chunk,error);
  return bVar1;
}

Assistant:

bool QueryResultChunkScanState::InternalLoad(ErrorData &error) {
	D_ASSERT(!finished);
	if (result.type == QueryResultType::STREAM_RESULT) {
		auto &stream_result = result.Cast<StreamQueryResult>();
		if (!stream_result.IsOpen()) {
			return true;
		}
	}
	return result.TryFetch(current_chunk, error);
}